

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefinitionIntroduction.cpp
# Opt level: O0

Term * __thiscall
Inferences::DefinitionIntroduction::lgg(DefinitionIntroduction *this,Term *left,Term *right)

{
  pair<Kernel::TermList,_Kernel::TermList> key;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined7 extraout_var;
  Term *pTVar5;
  size_t sVar6;
  IncompleteFunction *pIVar7;
  Term *pTVar8;
  __off_t __length;
  Term *in_RSI;
  IncompleteFunction IVar9;
  Term *term;
  Term *term_1;
  IncompleteFunction record;
  uint mapped;
  uint remaining;
  uint arity;
  uint functor;
  TermList right_top;
  TermList left_top;
  SubtermIterator right_it;
  SubtermIterator left_it;
  uint fresh;
  Term *in_stack_fffffffffffffe08;
  TermList in_stack_fffffffffffffe10;
  DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  TermList in_stack_fffffffffffffec8;
  uint uStack_f4;
  pair<Kernel::TermList,_Kernel::TermList> local_e0;
  pair<Kernel::TermList,_Kernel::TermList> local_d0;
  int local_bc;
  undefined8 local_b8;
  uint local_b0;
  uint local_a8;
  uint uStack_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  TermList local_90;
  TermList local_88 [2];
  undefined8 local_78;
  int local_1c;
  Term *local_10;
  
  local_1c = 0;
  local_10 = in_RSI;
  Kernel::SubtermIterator::SubtermIterator
            ((SubtermIterator *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
             (Term *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  Kernel::SubtermIterator::SubtermIterator
            ((SubtermIterator *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
             (Term *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  do {
    bVar1 = Kernel::SubtermIterator::hasNext((SubtermIterator *)in_stack_fffffffffffffe18);
    if (!bVar1) {
      Kernel::Term::functor(local_10);
      Kernel::Term::arity(local_10);
      Lib::Stack<Kernel::TermList>::begin((Stack<Kernel::TermList> *)Inferences::args);
      pTVar8 = Kernel::Term::create
                         ((uint)(in_stack_fffffffffffffec8._content >> 0x20),
                          (uint)in_stack_fffffffffffffec8._content,
                          (TermList *)
                          CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
      pTVar5 = pTVar8;
      Lib::Stack<Kernel::TermList>::reset((Stack<Kernel::TermList> *)Inferences::args);
      Lib::
      DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::reset((DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
               *)substitution);
      Kernel::SubtermIterator::~SubtermIterator((SubtermIterator *)pTVar5);
      Kernel::SubtermIterator::~SubtermIterator((SubtermIterator *)pTVar5);
      return pTVar8;
    }
    bVar1 = Kernel::SubtermIterator::hasNext((SubtermIterator *)in_stack_fffffffffffffe18);
    local_78 = CONCAT71(extraout_var,bVar1);
    if (!bVar1) {
      Kernel::SubtermIterator::~SubtermIterator
                ((SubtermIterator *)in_stack_fffffffffffffe10._content);
      _Unwind_Resume(local_78);
    }
    local_88[0] = Kernel::SubtermIterator::next((SubtermIterator *)in_stack_fffffffffffffe08);
    in_stack_fffffffffffffec8 =
         Kernel::SubtermIterator::next((SubtermIterator *)in_stack_fffffffffffffe08);
    local_90 = in_stack_fffffffffffffec8;
    in_stack_fffffffffffffec7 = Kernel::TermList::isTerm((TermList *)0x799b9b);
    if (((bool)in_stack_fffffffffffffec7) &&
       (in_stack_fffffffffffffec6 = Kernel::TermList::isTerm((TermList *)0x799bc1),
       (bool)in_stack_fffffffffffffec6)) {
      pTVar5 = Kernel::TermList::term((TermList *)0x799be7);
      uVar3 = Kernel::Term::functor(pTVar5);
      pTVar5 = Kernel::TermList::term((TermList *)0x799c14);
      uVar4 = Kernel::Term::functor(pTVar5);
      if (uVar3 != uVar4) goto LAB_00799d32;
      pTVar5 = Kernel::TermList::term((TermList *)0x799c57);
      local_94 = Kernel::Term::functor(pTVar5);
      pTVar5 = Kernel::TermList::term((TermList *)0x799c92);
      local_b0 = Kernel::Term::arity(pTVar5);
      local_a8 = local_94;
      local_b8 = CONCAT44(local_b0,local_94);
      IVar9._4_7_ = in_stack_fffffffffffffe30;
      IVar9.functor = in_stack_fffffffffffffe2c;
      IVar9.remaining._3_1_ = in_stack_fffffffffffffe37;
      uStack_a4 = local_b0;
      local_a0 = local_b0;
      local_9c = local_b0;
      local_98 = local_b0;
      Lib::Stack<Inferences::IncompleteFunction>::push
                ((Stack<Inferences::IncompleteFunction> *)in_stack_fffffffffffffe10._content,IVar9);
    }
    else {
LAB_00799d32:
      std::pair<Kernel::TermList,_Kernel::TermList>::
      pair<Kernel::TermList_&,_Kernel::TermList_&,_true>(&local_d0,local_88,&local_90);
      bVar1 = Lib::
              DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::find(in_stack_fffffffffffffe18,
                     (pair<Kernel::TermList,_Kernel::TermList> *)in_stack_fffffffffffffe10._content,
                     (uint *)in_stack_fffffffffffffe08);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::pair<Kernel::TermList,_Kernel::TermList>::
        pair<Kernel::TermList_&,_Kernel::TermList_&,_true>(&local_e0,local_88,&local_90);
        local_bc = local_1c;
        key.first._content._4_4_ = in_stack_fffffffffffffe2c;
        key.first._content._0_4_ = in_stack_fffffffffffffe28;
        key.second._content._0_7_ = in_stack_fffffffffffffe30;
        key.second._content._7_1_ = in_stack_fffffffffffffe37;
        local_1c = local_1c + 1;
        Lib::
        DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
        ::insert((DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),key,
                 (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      }
      Kernel::TermList::TermList
                ((TermList *)in_stack_fffffffffffffe10._content,
                 (uint)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffe08 >> 0x18,0));
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe10);
      Kernel::SubtermIterator::right((SubtermIterator *)in_stack_fffffffffffffe10._content);
      Kernel::SubtermIterator::right((SubtermIterator *)in_stack_fffffffffffffe10._content);
      bVar1 = Lib::Stack<Inferences::IncompleteFunction>::isNonEmpty
                        ((Stack<Inferences::IncompleteFunction> *)functions);
      if (bVar1) {
        pIVar7 = Lib::Stack<Inferences::IncompleteFunction>::top
                           ((Stack<Inferences::IncompleteFunction> *)functions);
        pIVar7->remaining = pIVar7->remaining - 1;
      }
    }
    while( true ) {
      bVar2 = Lib::Stack<Inferences::IncompleteFunction>::isNonEmpty
                        ((Stack<Inferences::IncompleteFunction> *)functions);
      bVar1 = false;
      if (bVar2) {
        pIVar7 = Lib::Stack<Inferences::IncompleteFunction>::top
                           ((Stack<Inferences::IncompleteFunction> *)functions);
        bVar1 = pIVar7->remaining == 0;
      }
      if (!bVar1) break;
      IVar9 = Lib::Stack<Inferences::IncompleteFunction>::pop
                        ((Stack<Inferences::IncompleteFunction> *)functions);
      uStack_f4 = IVar9.arity;
      Lib::Stack<Kernel::TermList>::end((Stack<Kernel::TermList> *)Inferences::args);
      Kernel::Term::create
                ((uint)(in_stack_fffffffffffffec8._content >> 0x20),
                 (uint)in_stack_fffffffffffffec8._content,
                 (TermList *)
                 CONCAT17(in_stack_fffffffffffffec7,
                          CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
      sVar6 = Lib::Stack<Kernel::TermList>::length((Stack<Kernel::TermList> *)Inferences::args);
      Lib::Stack<Kernel::TermList>::truncate
                ((Stack<Kernel::TermList> *)Inferences::args,(char *)(sVar6 - uStack_f4),__length);
      Kernel::TermList::TermList
                ((TermList *)in_stack_fffffffffffffe10._content,in_stack_fffffffffffffe08);
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe10);
      in_stack_fffffffffffffe37 =
           Lib::Stack<Inferences::IncompleteFunction>::isNonEmpty
                     ((Stack<Inferences::IncompleteFunction> *)functions);
      if (!(bool)in_stack_fffffffffffffe37) break;
      pIVar7 = Lib::Stack<Inferences::IncompleteFunction>::top
                         ((Stack<Inferences::IncompleteFunction> *)functions);
      in_stack_fffffffffffffe28 = SUB84(pIVar7,0);
      in_stack_fffffffffffffe2c = (undefined4)((ulong)pIVar7 >> 0x20);
      pIVar7->remaining = pIVar7->remaining - 1;
    }
  } while( true );
}

Assistant:

Term *DefinitionIntroduction::lgg(Term *left, Term *right) {
  ASS_EQ(left->functor(), right->functor())
  ASS_EQ(functions.length(), 0)
  ASS_EQ(args.length(), 0)

  unsigned fresh = 0;
  SubtermIterator left_it(left);
  SubtermIterator right_it(right);

  while(left_it.hasNext()) {
    ALWAYS(right_it.hasNext());
    TermList left_top = left_it.next();
    TermList right_top = right_it.next();

    if(left_top.isTerm() && right_top.isTerm() && left_top.term()->functor() == right_top.term()->functor()) {
      unsigned functor = left_top.term()->functor();
      unsigned arity = left_top.term()->arity();
      unsigned remaining = arity;
      functions.push({functor, arity, remaining});
    }
    else {
      unsigned mapped;
      if(!substitution.find({left_top, right_top}, mapped))
        substitution.insert({left_top, right_top}, mapped = fresh++);

      args.push(TermList(mapped, false));
      left_it.right();
      right_it.right();

      if(functions.isNonEmpty())
        functions.top().remaining--;
    }

    while(functions.isNonEmpty() && !functions.top().remaining) {
      IncompleteFunction record = functions.pop();
      Term *term = Term::create(record.functor, record.arity, args.end() - record.arity);
      args.truncate(args.length() - record.arity);
      args.push(TermList(term));

      if(functions.isNonEmpty())
        functions.top().remaining--;
      else
        break;
    }
  }

  ASS(functions.isEmpty());
  ASS_EQ(args.length(), left->arity());
  Term *term = Term::create(left->functor(), left->arity(), args.begin());

  args.reset();
  substitution.reset();
  return term;
}